

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

double __thiscall libDAI::TRW::runTRW(TRW *this)

{
  value vVar1;
  size_t iI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  size_type __n;
  undefined4 extraout_var_01;
  ulong uVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  size_t i;
  ulong uVar8;
  pointer pVVar9;
  size_t t_2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Real x;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 local_f8 [16];
  double local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  Factor nb;
  Diffs diffs;
  undefined1 extraout_var_08 [56];
  
  if ((this->Props).verbose != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&diffs,this);
    poVar5 = std::operator<<(poVar5,(string *)&diffs);
    std::operator<<(poVar5,":inner_loop ...");
    std::__cxx11::string::~string((string *)&diffs);
    if (2 < (this->Props).verbose) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  init_messages(this);
  toc();
  iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x28))
                    ((long *)CONCAT44(extraout_var,iVar4));
  Diffs::Diffs(&diffs,lVar6,1.0);
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  __n = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x28))
                  ((long *)CONCAT44(extraout_var_00,iVar4));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&old_beliefs,__n);
  uVar8 = 0;
  while( true ) {
    iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x28))
                      ((long *)CONCAT44(extraout_var_01,iVar4));
    if (uVar7 <= uVar8) break;
    beliefV(&nb,this,uVar8);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
               &old_beliefs,&nb);
    TFactor<double>::~TFactor(&nb);
    uVar8 = uVar8 + 1;
  }
  local_e8 = extraout_XMM0_Qa;
  iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&edge_seq,
             *(long *)(CONCAT44(extraout_var_02,iVar4) + 0x48) -
             *(long *)(CONCAT44(extraout_var_02,iVar4) + 0x40) >> 4);
  pVVar9 = (pointer)0x0;
  while( true ) {
    nb._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar9;
    iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((pointer)(*(long *)(CONCAT44(extraout_var_03,iVar4) + 0x48) -
                  *(long *)(CONCAT44(extraout_var_03,iVar4) + 0x40) >> 4) <= pVVar9) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&edge_seq,(value_type_conflict2 *)&nb);
    pVVar9 = (pointer)((long)&(nb._vs._vars.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_start)->_label + 1);
  }
  (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
  uVar8 = 0;
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = 0x7ff0000000000000;
  do {
    this->_iterations = uVar8;
    dVar10 = (this->Props).tol;
    if (((this->Props).maxiter <= uVar8) || ((double)local_f8._0_8_ <= dVar10)) {
      if (this->_maxdiff < (double)local_f8._0_8_) {
        this->_maxdiff = (double)local_f8._0_8_;
      }
      uVar8 = (this->Props).verbose;
      if (uVar8 != 0) {
        if ((double)local_f8._0_8_ <= dVar10) {
          if (2 < uVar8) {
            std::operator<<((ostream *)&std::cout,"TRW::runTRW:  ");
          }
          poVar5 = std::operator<<((ostream *)&std::cout,"converged in ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5," passes (");
          toc();
          poVar5 = std::ostream::_M_insert<long>((long)poVar5);
          poVar5 = std::operator<<(poVar5," clocks).");
        }
        else {
          if (uVar8 == 1) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "TRW::runTRW:  WARNING: not converged within ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5," passes (");
          toc();
          poVar5 = std::ostream::_M_insert<long>((long)poVar5);
          std::operator<<(poVar5," clocks)...final maxdiff:");
          poVar5 = std::ostream::_M_insert<double>((double)local_f8._0_8_);
        }
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
                (&old_beliefs);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&diffs);
      return (double)local_f8._0_8_;
    }
    vVar1 = (this->Props).updates.v;
    if (vVar1 == SEQRND) {
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
LAB_00502449:
      uVar8 = 0;
      while( true ) {
        iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if ((ulong)(*(long *)(CONCAT44(extraout_var_05,iVar4) + 0x48) -
                    *(long *)(CONCAT44(extraout_var_05,iVar4) + 0x40) >> 4) <= uVar8) break;
        iI = edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
        calcNewMessage(this,iI);
        updateMessage(this,iI);
        uVar8 = uVar8 + 1;
      }
    }
    else {
      if (vVar1 != PARALL) goto LAB_00502449;
      uVar8 = 0;
      while( true ) {
        iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if ((ulong)(*(long *)(CONCAT44(extraout_var_04,iVar4) + 0x48) -
                    *(long *)(CONCAT44(extraout_var_04,iVar4) + 0x40) >> 4) <= uVar8) break;
        calcNewMessage(this,uVar8);
        uVar8 = uVar8 + 1;
      }
      uVar8 = 0;
      while( true ) {
        iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if ((ulong)(*(long *)(CONCAT44(extraout_var_06,iVar4) + 0x48) -
                    *(long *)(CONCAT44(extraout_var_06,iVar4) + 0x40) >> 4) <= uVar8) break;
        updateMessage(this,uVar8);
        uVar8 = uVar8 + 1;
      }
    }
    lVar6 = 0;
    uVar8 = 0;
    while( true ) {
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x28))
                        ((long *)CONCAT44(extraout_var_07,iVar4));
      if (uVar7 <= uVar8) break;
      beliefV(&nb,this,uVar8);
      x = dist(&nb,(TFactor<double> *)
                   ((long)&((old_beliefs.
                             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar6),DISTLINF);
      Diffs::push(&diffs,x);
      TFactor<double>::operator=
                ((TFactor<double> *)
                 ((long)&((old_beliefs.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar6),&nb);
      TFactor<double>::~TFactor(&nb);
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x38;
    }
    dVar10 = extraout_XMM0_Qa_00;
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
    if ((this->Props).verbose < 3) {
      auVar2._8_8_ = 0x7fffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar10 - local_e8;
      local_f8 = vandpd_avx512vl(auVar13,auVar2);
    }
    else {
      std::operator<<((ostream *)&std::cout,"TRW::runTRW:  maxdiff ");
      dVar11 = Diffs::max(&diffs);
      poVar5 = std::ostream::_M_insert<double>(dVar11);
      std::operator<<(poVar5,", logZ_diff ");
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar10 - local_e8;
      local_f8 = vandpd_avx512vl(auVar12,auVar3);
      poVar5 = std::ostream::_M_insert<double>(local_f8._0_8_);
      poVar5 = std::operator<<(poVar5," after ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," passes");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    auVar14._0_8_ = Diffs::max(&diffs);
    auVar14._8_56_ = extraout_var_08;
    uVar8 = this->_iterations + 1;
    auVar2 = vmaxsd_avx(local_f8,auVar14._0_16_);
    local_f8._0_8_ = auVar2._0_8_;
    local_e8 = dVar10;
  } while( true );
}

Assistant:

double TRW::runTRW() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << ":inner_loop ...";
        if( Props.verbose >= 3)
           cout << endl; 

        init_messages();

        clock_t tic = toc();
        Diffs   diffs(grm().nrVars(), 1.0);
        
        vector<size_t> edge_seq;

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(beliefV(i));

        edge_seq.reserve( grm().nrEdges() );
        for( size_t e = 0; e < grm().nrEdges(); e++ )
            edge_seq.push_back( e );

        double logZ_prev = INFINITY;
        double logZ_cur  = real(logZ());

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        // and logZ difference is smaller than tolerance
        double diff = INFINITY;
        for( _iterations = 0; _iterations < Props.maxiter && diff > Props.tol; _iterations++ ) {
            if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < grm().nrEdges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < grm().nrEdges(); t++ )
                    updateMessage( t );
            } else {
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );
                
                for( size_t t = 0; t < grm().nrEdges(); t++ ) {
                    size_t k = edge_seq[t];
                    calcNewMessage( k );
                    updateMessage( k );
                }
            }

            // calculate new beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( beliefV(i) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }
            logZ_prev = logZ_cur;
            logZ_cur  = real(logZ());

            if( Props.verbose >= 3 )
                cout << "TRW::runTRW:  maxdiff " << diffs.max() << ", logZ_diff " << fabs(logZ_cur - logZ_prev) << " after " << _iterations+1 << " passes" << endl;

            diff = diffs.max();
            if( fabs(logZ_cur - logZ_prev) > diff )
                diff = fabs(logZ_cur - logZ_prev);
        }

        if( diff > _maxdiff )
            _maxdiff = diff;

        if( Props.verbose >= 1 ) {
            if( diff > Props.tol ) {
                if( Props.verbose == 1 )
                    cout << endl;
                    cout << "TRW::runTRW:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diff << endl;
            } else {
                if( Props.verbose >= 3 )
                    cout << "TRW::runTRW:  ";
                    cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diff;
    }